

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
fire::arg::_get<std::__cxx11::string>
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,arg *this)

{
  bool pass;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::_matcher::arg_type>
  elem;
  arg *this_local;
  
  elem._32_8_ = this;
  _matcher::get_and_mark_as_queried_abi_cxx11_
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::_matcher::arg_type>
              *)local_40,(_matcher *)_storage<void>::matcher,&this->_id);
  pass = elem.first.field_2._8_4_ != 1;
  identifier::help_abi_cxx11_(&local_a0,&this->_id);
  std::operator+(&local_80,"argument ",&local_a0);
  std::operator+(&local_60,&local_80," must have value");
  _matcher::deferred_assert((_matcher *)_storage<void>::matcher,&this->_id,pass,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  if (elem.first.field_2._8_4_ == 0) {
    std::__cxx11::string::string((string *)&local_d0,(string *)local_40);
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional(__return_storage_ptr__,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional(__return_storage_ptr__,&this->_string_value);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::_matcher::arg_type>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::_matcher::arg_type>
           *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline optional<std::string> arg::_get<std::string>() {
        auto elem = _::matcher.get_and_mark_as_queried(_id);
        _::matcher.deferred_assert(_id, elem.second != _matcher::arg_type::bool_t,
                                   "argument " + _id.help() + " must have value");

        if(elem.second == _matcher::arg_type::string_t)
            return elem.first;
        return _string_value;
    }